

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_casts.cpp
# Opt level: O2

bool duckdb::ListToVarcharCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  VectorType VVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  pointer __p;
  bool bVar8;
  Vector *pVVar9;
  idx_t iVar10;
  pointer __p_00;
  Vector *vector;
  long lVar11;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  undefined8 extraout_RDX_01;
  idx_t extraout_RDX_02;
  idx_t extraout_RDX_03;
  data_ptr_t pdVar12;
  char *pcVar13;
  ulong idx;
  data_ptr_t pdVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  idx_t list_idx;
  Vector *pVVar18;
  undefined1 auVar19 [16];
  anon_struct_16_3_d7536bce_for_pointer aVar20;
  unsafe_unique_array<bool> needs_quotes;
  code *local_f8;
  code *local_f0;
  ulong local_c8;
  __uniq_ptr_impl<bool,_std::default_delete<bool[]>_> local_b8;
  LogicalType local_b0;
  Vector varchar_list;
  
  VVar2 = source->vector_type;
  LogicalType::LogicalType((LogicalType *)&needs_quotes,VARCHAR);
  LogicalType::LIST(&local_b0,(LogicalType *)&needs_quotes);
  Vector::Vector(&varchar_list,&local_b0,count);
  LogicalType::~LogicalType(&local_b0);
  LogicalType::~LogicalType((LogicalType *)&needs_quotes);
  ListCast::ListToListCast(source,&varchar_list,count,parameters);
  pVVar9 = ListVector::GetEntry(source);
  bVar7 = (pVVar9->type).physical_type_ - LIST;
  if (bVar7 < 7) {
    local_f0 = (code *)(&PTR_CalculateStringLength_027942c8)[bVar7];
    local_f8 = (code *)(&PTR_WriteString_02794300)[bVar7];
  }
  else {
    local_f8 = VectorCastHelpers::WriteEscapedString<false>;
    local_f0 = VectorCastHelpers::CalculateEscapedStringLength<false>;
  }
  Vector::Flatten(&varchar_list,count);
  pVVar9 = ListVector::GetEntry(&varchar_list);
  FlatVector::VerifyFlatVector(&varchar_list);
  iVar10 = ListVector::GetListSize(&varchar_list);
  Vector::Flatten(pVVar9,iVar10);
  pdVar3 = pVVar9->data;
  FlatVector::VerifyFlatVector(pVVar9);
  pdVar4 = result->data;
  needs_quotes.super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (unique_ptr<bool[],_std::default_delete<bool[]>_>)
                 (__uniq_ptr_data<bool,_std::default_delete<bool[]>,_true,_true>)0x0;
  iVar10 = extraout_RDX;
  for (idx = 0; idx != count; idx = idx + 1) {
    if ((varchar_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((varchar_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[idx >> 6] >>
         (idx & 0x3f) & 1) != 0)) {
      lVar15 = idx * 0x10;
      lVar5 = *(long *)(varchar_list.data + lVar15);
      uVar6 = *(ulong *)(varchar_list.data + lVar15 + 8);
      if ((needs_quotes.super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
           super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
           super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
           super__Head_base<0UL,_bool_*,_false>._M_head_impl ==
           (__uniq_ptr_data<bool,_std::default_delete<bool[]>,_true,_true>)0x0) ||
         (local_c8 < uVar6)) {
        __p_00 = (pointer)operator_new__(uVar6);
        local_b8._M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl =
             (tuple<bool_*,_std::default_delete<bool[]>_>)
             (_Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>)0x0;
        ::std::__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>::reset
                  ((__uniq_ptr_impl<bool,_std::default_delete<bool[]>_> *)&needs_quotes,__p_00);
        ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
                  ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)&local_b8);
        iVar10 = extraout_RDX_00;
        local_c8 = uVar6;
      }
      pdVar14 = pdVar3 + lVar5 * 0x10;
      vector = (Vector *)0x2;
      pdVar12 = pdVar14;
      for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
        pVVar18 = (Vector *)&vector->field_0x2;
        if (uVar16 == 0) {
          pVVar18 = vector;
        }
        bVar8 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                           lVar5 + uVar16);
        auVar19._8_8_ = extraout_RDX_01;
        auVar19._0_8_ = 4;
        if (bVar8) {
          auVar19 = (*local_f0)(pdVar12,(long)needs_quotes.
                                              super_unique_ptr<bool[],_std::default_delete<bool[]>_>
                                              ._M_t.
                                              super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>
                                              .super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                                        uVar16);
        }
        iVar10 = auVar19._8_8_;
        vector = (Vector *)(&pVVar18->vector_type + auVar19._0_8_);
        pdVar12 = pdVar12 + 0x10;
      }
      aVar20 = (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::EmptyString((StringVector *)result,vector,iVar10);
      paVar1 = (anon_union_16_2_67f50693_for_value *)(pdVar4 + lVar15);
      paVar1->pointer = aVar20;
      pcVar13 = aVar20.ptr;
      if (aVar20.length < 0xd) {
        pcVar13 = (paVar1->pointer).prefix;
      }
      *pcVar13 = '[';
      lVar17 = 1;
      for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
        if (uVar16 != 0) {
          (pcVar13 + lVar17)[0] = ',';
          (pcVar13 + lVar17)[1] = ' ';
          lVar17 = lVar17 + 2;
        }
        bVar8 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>,
                           lVar5 + uVar16);
        if (bVar8) {
          lVar11 = (*local_f8)(pcVar13 + lVar17,pdVar14,
                               *(undefined1 *)
                                ((long)needs_quotes.
                                       super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
                                       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                       super__Head_base<0UL,_bool_*,_false>._M_head_impl + uVar16));
        }
        else {
          builtin_strncpy(pcVar13 + lVar17,"NULL",4);
          lVar11 = 4;
        }
        lVar17 = lVar17 + lVar11;
        pdVar14 = pdVar14 + 0x10;
      }
      pcVar13[lVar17] = ']';
      string_t::Finalize((string_t *)(pdVar4 + lVar15));
      iVar10 = extraout_RDX_02;
    }
    else {
      FlatVector::SetNull(result,idx,true);
      iVar10 = extraout_RDX_03;
    }
  }
  if (VVar2 == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
            (&needs_quotes.super_unique_ptr<bool[],_std::default_delete<bool[]>_>);
  Vector::~Vector(&varchar_list);
  return true;
}

Assistant:

static bool ListToVarcharCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto constant = source.GetVectorType() == VectorType::CONSTANT_VECTOR;
	// first cast the child vector to varchar
	Vector varchar_list(LogicalType::LIST(LogicalType::VARCHAR), count);
	ListCast::ListToListCast(source, varchar_list, count, parameters);

	auto &child_vec = ListVector::GetEntry(source);
	auto child_is_nested = child_vec.GetType().IsNested();
	auto string_length_func = child_is_nested ? VectorCastHelpers::CalculateStringLength
	                                          : VectorCastHelpers::CalculateEscapedStringLength<false>;
	auto write_string_func =
	    child_is_nested ? VectorCastHelpers::WriteString : VectorCastHelpers::WriteEscapedString<false>;

	// now construct the actual varchar vector
	varchar_list.Flatten(count);
	auto &child = ListVector::GetEntry(varchar_list);
	auto list_data = FlatVector::GetData<list_entry_t>(varchar_list);
	auto &validity = FlatVector::Validity(varchar_list);

	child.Flatten(ListVector::GetListSize(varchar_list));
	auto child_data = FlatVector::GetData<string_t>(child);
	auto &child_validity = FlatVector::Validity(child);

	auto result_data = FlatVector::GetData<string_t>(result);
	static constexpr const idx_t SEP_LENGTH = 2;
	static constexpr const idx_t NULL_LENGTH = 4;
	unsafe_unique_array<bool> needs_quotes;
	idx_t needs_quotes_length;

	for (idx_t i = 0; i < count; i++) {
		if (!validity.RowIsValid(i)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}
		auto list = list_data[i];
		// figure out how long the result needs to be
		idx_t list_length = 2; // "[" and "]"
		if (!needs_quotes || list.length > needs_quotes_length) {
			needs_quotes = make_unsafe_uniq_array_uninitialized<bool>(list.length);
			needs_quotes_length = list.length;
		}
		for (idx_t list_idx = 0; list_idx < list.length; list_idx++) {
			auto idx = list.offset + list_idx;
			if (list_idx > 0) {
				list_length += SEP_LENGTH; // ", "
			}
			// string length, or "NULL"
			if (child_validity.RowIsValid(idx)) {
				list_length += string_length_func(child_data[idx], needs_quotes[list_idx]);
			} else {
				list_length += NULL_LENGTH;
			}
		}
		result_data[i] = StringVector::EmptyString(result, list_length);
		auto dataptr = result_data[i].GetDataWriteable();
		idx_t offset = 0;
		dataptr[offset++] = '[';
		for (idx_t list_idx = 0; list_idx < list.length; list_idx++) {
			auto idx = list.offset + list_idx;
			if (list_idx > 0) {
				memcpy(dataptr + offset, ", ", SEP_LENGTH);
				offset += SEP_LENGTH;
			}
			if (child_validity.RowIsValid(idx)) {
				offset += write_string_func(dataptr + offset, child_data[idx], needs_quotes[list_idx]);
			} else {
				memcpy(dataptr + offset, "NULL", NULL_LENGTH);
				offset += NULL_LENGTH;
			}
		}
		dataptr[offset] = ']';
		result_data[i].Finalize();
	}

	if (constant) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	return true;
}